

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O1

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::Phase
          (Phase<std::complex<double>_> *this,int qubit,real_type theta,bool fixed)

{
  double dVar1;
  
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00125b38;
  (this->super_QGate1<std::complex<double>_>).qubit_ = qubit;
  if (-1 < qubit) {
    (this->super_QGate1<std::complex<double>_>).field_0xc = fixed;
    (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00125d48;
    dVar1 = ::cos(theta);
    (this->angle_).cos_ = dVar1;
    dVar1 = ::sin(theta);
    (this->angle_).sin_ = dVar1;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/QGate1.hpp"
                ,0x21,
                "qclab::qgates::QGate1<std::complex<double>>::QGate1(const int) [T = std::complex<double>]"
               );
}

Assistant:

Phase()
        : QGate1< T >( 0 )
        , angle_( 0 )
        , QAdjustable( false )
        { }